

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

bool __thiscall
miniros::NodeHandle::getParamNames
          (NodeHandle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000f0;
  MasterLink *in_stack_000000f8;
  NodeHandle *in_stack_ffffffffffffffd8;
  
  getMasterLink(in_stack_ffffffffffffffd8);
  std::__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x47ac0a);
  bVar1 = MasterLink::getParamNames(in_stack_000000f8,in_stack_000000f0);
  std::shared_ptr<miniros::MasterLink>::~shared_ptr((shared_ptr<miniros::MasterLink> *)0x47ac27);
  return bVar1;
}

Assistant:

bool NodeHandle::getParamNames(std::vector<std::string>& keys) const
{
  return getMasterLink()->getParamNames(keys);
}